

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTxOutReference::GetSerializeSize
          (ConfidentialTxOutReference *this,bool is_blinded,uint32_t *witness_area_size,
          uint32_t *no_witness_area_size,int exponent,int minimum_bits,uint32_t *rangeproof_size,
          uint32_t input_asset_count)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  CfdException *this_00;
  Amount AVar4;
  byte local_f9;
  ByteData local_f8;
  int64_t local_e0;
  undefined1 local_d8;
  Amount local_d0;
  int64_t local_c0;
  int64_t amount;
  uint32_t work_proof_size;
  CfdSourceLocation local_90;
  int local_74;
  size_t sStack_70;
  int ret;
  size_t size;
  ByteData local_58;
  byte local_39;
  uint32_t local_38;
  uint32_t uStack_34;
  bool is_blind;
  uint32_t witness_size;
  uint32_t result;
  int minimum_bits_local;
  int exponent_local;
  uint32_t *no_witness_area_size_local;
  uint32_t *witness_area_size_local;
  ConfidentialTxOutReference *pCStack_10;
  bool is_blinded_local;
  ConfidentialTxOutReference *this_local;
  
  uStack_34 = 0;
  local_38 = 0;
  local_f9 = 1;
  witness_size = minimum_bits;
  result = exponent;
  _minimum_bits_local = no_witness_area_size;
  no_witness_area_size_local = witness_area_size;
  witness_area_size_local._7_1_ = is_blinded;
  pCStack_10 = this;
  if (!is_blinded) {
    bVar1 = ConfidentialNonce::IsEmpty(&this->nonce_);
    local_f9 = bVar1 ^ 0xff;
  }
  local_39 = local_f9 & 1;
  if (((local_39 == 0) ||
      (bVar1 = Script::IsEmpty(&(this->super_AbstractTxOutReference).locking_script_), bVar1)) ||
     (bVar1 = Script::IsPegoutScript(&(this->super_AbstractTxOutReference).locking_script_), bVar1))
  {
    uStack_34 = uStack_34 + 0x2a;
    bVar1 = Script::IsEmpty(&(this->super_AbstractTxOutReference).locking_script_);
    if (bVar1) {
      uStack_34 = uStack_34 + 2;
    }
    else {
      uStack_34 = uStack_34 + 1;
      Script::GetData(&local_f8,&(this->super_AbstractTxOutReference).locking_script_);
      sVar3 = ByteData::GetSerializeSize(&local_f8);
      uStack_34 = (int)sVar3 + uStack_34;
      ByteData::~ByteData(&local_f8);
    }
    local_38 = local_38 + 2;
  }
  else {
    uStack_34 = uStack_34 + 99;
    Script::GetData(&local_58,&(this->super_AbstractTxOutReference).locking_script_);
    sVar3 = ByteData::GetSerializeSize(&local_58);
    uStack_34 = (int)sVar3 + uStack_34;
    ByteData::~ByteData(&local_58);
    if (input_asset_count == 0) {
      local_38 = local_38 + 0xa3;
    }
    else {
      sStack_70 = 0;
      local_74 = wally_asset_surjectionproof_size((ulong)input_asset_count,&stack0xffffffffffffff90)
      ;
      if (local_74 != 0) {
        local_90.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_90.filename = local_90.filename + 1;
        local_90.line = 0x4b0;
        local_90.funcname = "GetSerializeSize";
        logger::warn<int&>(&local_90,"wally_asset_surjectionproof_size NG[{}]",&local_74);
        amount._6_1_ = 1;
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&work_proof_size,"calc asset surjectionproof size error.",
                   (allocator *)((long)&amount + 7));
        CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&work_proof_size);
        amount._6_1_ = 0;
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_38 = (int)sStack_70 + 1 + local_38;
      local_74 = 0;
    }
    amount._0_4_ = 0;
    if ((rangeproof_size == (uint32_t *)0x0) || (*rangeproof_size == 0)) {
      bVar1 = ConfidentialValue::HasBlinding(&this->confidential_value_);
      if (bVar1) {
        sVar3 = ByteData::GetDataSize(&this->range_proof_);
        amount._0_4_ = (int)sVar3 + 4;
      }
      else {
        AVar4 = ConfidentialValue::GetAmount(&this->confidential_value_);
        local_e0 = AVar4.amount_;
        local_d8 = AVar4.ignore_check_;
        local_d0.amount_ = local_e0;
        local_d0.ignore_check_ = (bool)local_d8;
        local_c0 = Amount::GetSatoshiValue(&local_d0);
        if (local_c0 == 0) {
          bVar1 = ConfidentialNonce::IsEmpty(&this->nonce_);
          local_c0 = 1;
          if (bVar1) {
            local_c0 = 2100000000000000;
          }
        }
        uVar2 = CalculateRangeProofSize(local_c0,result,witness_size);
        amount._0_4_ = uVar2 + 4;
        if (rangeproof_size != (uint32_t *)0x0) {
          *rangeproof_size = (uint32_t)amount;
        }
      }
    }
    else {
      amount._0_4_ = *rangeproof_size;
    }
    local_38 = (uint32_t)amount + local_38;
  }
  if (no_witness_area_size_local != (uint32_t *)0x0) {
    *no_witness_area_size_local = local_38;
  }
  if (_minimum_bits_local != (uint32_t *)0x0) {
    *_minimum_bits_local = uStack_34;
  }
  return local_38 + uStack_34;
}

Assistant:

uint32_t ConfidentialTxOutReference::GetSerializeSize(
    bool is_blinded, uint32_t *witness_area_size,
    uint32_t *no_witness_area_size, int exponent, int minimum_bits,
    uint32_t *rangeproof_size, uint32_t input_asset_count) const {
  static constexpr const uint32_t kTxOutMaxSurjection = 162 + 1;
  // SECP256K1_SURJECTIONPROOF_SERIALIZATION_BYTES(256, 3) = 162
  // ((n + 7)/8 + 34 + 32m) (m: 1 to 3)
  // n=1:  (1 + 34 + 32) = 67
  // n=2:  (1 + 98) = 99
  // n>=3: ((n + 7)/8 + 130)

  // static constexpr const uint32_t kTxOutRangeproof = 2893 + 3;
  uint32_t result = 0;
  uint32_t witness_size = 0;
  bool is_blind = is_blinded || (!nonce_.IsEmpty());
  if (is_blind && (!locking_script_.IsEmpty()) &&
      (!locking_script_.IsPegoutScript())) {
    result += kConfidentialDataSize;  // asset
    result += kConfidentialDataSize;  // value
    result += kConfidentialDataSize;  // nonce
    result +=
        static_cast<uint32_t>(locking_script_.GetData().GetSerializeSize());

    if (input_asset_count == 0) {
      witness_size += kTxOutMaxSurjection;  // maximum surjection proof
    } else {
      size_t size = 0;
      int ret = wally_asset_surjectionproof_size(input_asset_count, &size);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_asset_surjectionproof_size NG[{}]", ret);
        throw CfdException(
            kCfdIllegalStateError, "calc asset surjectionproof size error.");
      }
      witness_size += static_cast<uint32_t>(size) + 1;
    }
    // witness_size += kTxOutRangeproof;  // range proof
    uint32_t work_proof_size = 0;
    if ((rangeproof_size != nullptr) && (*rangeproof_size != 0)) {
      work_proof_size = *rangeproof_size;
    } else if (confidential_value_.HasBlinding()) {
      work_proof_size = 4 + static_cast<uint32_t>(range_proof_.GetDataSize());
    } else {
      int64_t amount = confidential_value_.GetAmount().GetSatoshiValue();
      if (amount == 0) amount = (nonce_.IsEmpty()) ? kMaxAmount : 1;
      work_proof_size =
          4 + CalculateRangeProofSize(amount, exponent, minimum_bits);
      if (rangeproof_size != nullptr) *rangeproof_size = work_proof_size;
    }
    witness_size += work_proof_size;
  } else {
    result += kConfidentialDataSize;   // asset
    result += kConfidentialValueSize;  // value
    if (locking_script_.IsEmpty()) {
      result += 2;  // fee (nonce & lockingScript empty.)
    } else {
      result += 1;  // nonce
      result +=
          static_cast<uint32_t>(locking_script_.GetData().GetSerializeSize());
    }
    witness_size += 1;  // surjection proof
    witness_size += 1;  // range proof
  }

  if (witness_area_size != nullptr) {
    *witness_area_size = witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size = result;
  }
  result += witness_size;
  return result;
}